

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int process_opts(int argc,char **argv,nt_opts *opts)

{
  str_list *slist;
  nt_opts *__s1;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ushort **ppuVar7;
  long lVar8;
  char *pcVar9;
  nt_opts *prog;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  field_s nhdr_fields [47];
  uint local_97c;
  field_s local_918 [63];
  
  prog = opts;
  memset(opts,0,0x900);
  opts->new_datatype = 4;
  opts->debug = 1;
  opts->new_dim[0] = 3;
  opts->new_dim[1] = 1;
  opts->new_dim[2] = 1;
  opts->new_dim[3] = 1;
  if (1 < argc) {
    slist = &opts->elist;
    uVar4 = (ulong)(uint)argc;
    uVar10 = 1;
    do {
      lVar5 = (long)(int)uVar10;
      __s1 = (nt_opts *)argv[lVar5];
      iVar2 = strncmp((char *)__s1,"-help_datatypes",9);
      if (iVar2 == 0) {
        if ((int)(uVar10 + 1) < argc) {
          switch((*argv[(int)(uVar10 + 1)] + 0xbcU) * '\x10' |
                 (byte)(*argv[(int)(uVar10 + 1)] + 0xbcU) >> 4) {
          case 0:
          case 2:
            nifti_disp_type_list(1);
            return 1;
          case 1:
          case 3:
            nifti_test_datatype_sizes(1);
            return 1;
          default:
            iVar2 = 2;
          }
        }
        else {
          iVar2 = 3;
        }
        nifti_disp_type_list(iVar2);
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-help_hdr",9);
      if (iVar2 == 0) {
        fill_hdr_field_array(local_918);
        pcVar9 = "nifti_1_header: ";
        iVar2 = 0x2b;
LAB_001079b7:
        disp_field_s_list(pcVar9,local_918,iVar2);
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-help_nim",9);
      if (iVar2 == 0) {
        fill_nim_field_array(local_918);
        pcVar9 = "nifti_image: ";
        iVar2 = 0x3f;
        goto LAB_001079b7;
      }
      iVar2 = strncmp((char *)__s1,"-help_ana",9);
      if (iVar2 == 0) {
        fill_ana_field_array(local_918);
        pcVar9 = "nifti_analyze75: ";
        iVar2 = 0x2f;
        goto LAB_001079b7;
      }
      prog = __s1;
      iVar2 = strncmp((char *)__s1,"-help",5);
      if (iVar2 == 0) break;
      iVar2 = strncmp((char *)__s1,"-hist",5);
      if (iVar2 == 0) {
        lVar5 = 0;
        do {
          fputs(*(char **)((long)g_history + lVar5),_stdout);
          lVar5 = lVar5 + 8;
        } while (lVar5 != 0xe8);
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-ver",2);
      if (iVar2 == 0) {
        fprintf(_stdout,"%s, %s\n",*argv,g_version);
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-nifti_hist",0xb);
      if (iVar2 == 0) {
        nifti_disp_lib_hist();
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-nifti_ver",10);
      if (iVar2 == 0) {
        nifti_disp_lib_version();
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-with_zlib",5);
      if (iVar2 == 0) {
        iVar2 = nifti_compiled_with_zlib();
        pcVar9 = "YES";
        if (iVar2 == 0) {
          pcVar9 = "NO";
        }
        printf("Was NIfTI library compiled with zlib?  %s\n",pcVar9);
        return 1;
      }
      iVar2 = strncmp((char *)__s1,"-add_afni_ext",9);
      if (iVar2 == 0) {
        if (argc <= (int)(uVar10 + 1)) {
          process_opts_cold_13();
          return 1;
        }
        iVar2 = add_string(slist,argv[(int)(uVar10 + 1)]);
        if (iVar2 != 0) {
          return -1;
        }
        iVar2 = 4;
LAB_00107118:
        uVar10 = uVar10 + 1;
        iVar2 = add_int(&opts->etypes,iVar2);
        if (iVar2 != 0) {
          return -1;
        }
        opts->add_exts = 1;
      }
      else {
        iVar2 = strncmp((char *)__s1,"-add_comment_ext",9);
        if (iVar2 == 0) {
          if (argc <= (int)(uVar10 + 1)) {
            process_opts_cold_12();
            return 1;
          }
          iVar2 = add_string(slist,argv[(int)(uVar10 + 1)]);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = 6;
          goto LAB_00107118;
        }
        iVar2 = strncmp((char *)__s1,"-check_hdr",10);
        if (iVar2 == 0) {
          opts->check_hdr = 1;
        }
        else {
          iVar2 = strncmp((char *)__s1,"-check_nim",10);
          if (iVar2 == 0) {
            opts->check_nim = 1;
          }
          else {
            iVar2 = strncmp((char *)__s1,"-copy_brick_list",0xb);
            if (((iVar2 == 0) || (iVar2 = strncmp((char *)__s1,"-copy_im",10), iVar2 == 0)) ||
               (iVar2 = strncmp((char *)__s1,"-cbl",4), iVar2 == 0)) {
              opts->cbl = 1;
            }
            else {
              iVar2 = strncmp((char *)__s1,"-copy_collapsed_image",10);
              if ((iVar2 == 0) || (iVar2 = strncmp((char *)__s1,"-cci",4), iVar2 == 0)) {
                opts->ci_dims[0] = 0;
                bVar14 = false;
                uVar11 = 0;
                do {
                  iVar2 = (int)uVar11;
                  if ((long)uVar4 <= (long)(lVar5 + 1 + uVar11)) {
                    process_opts_cold_11();
                    local_97c = 1;
                    goto LAB_001071f6;
                  }
                  ppuVar7 = __ctype_b_loc();
                  pcVar9 = argv[lVar5 + uVar11 + 1];
                  if (((*(byte *)((long)*ppuVar7 + (long)*pcVar9 * 2 + 1) & 8) == 0) &&
                     (iVar3 = strcmp(pcVar9,"-1"), iVar3 != 0)) {
                    fprintf(_stderr,
                            "** -cci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                            ,(ulong)(iVar2 + 1),pcVar9);
                    local_97c = 0xffffffff;
                    goto LAB_001071f6;
                  }
                  uVar6 = uVar11 + 1;
                  iVar3 = atoi(pcVar9);
                  opts->ci_dims[uVar11 + 1] = iVar3;
                  bVar14 = 6 < uVar6;
                  uVar11 = uVar6;
                } while (uVar6 != 7);
                opts->cci = 1;
LAB_001071f6:
                if (!bVar14) {
                  return local_97c;
                }
                uVar10 = uVar10 + 1 + iVar2;
              }
              else {
                iVar2 = strncmp((char *)__s1,"-debug",6);
                if (iVar2 == 0) {
                  uVar10 = uVar10 + 1;
                  if (argc <= (int)uVar10) {
                    process_opts_cold_10();
                    return 1;
                  }
                  iVar2 = atoi(argv[(int)uVar10]);
                  opts->debug = iVar2;
                }
                else {
                  iVar2 = strncmp((char *)__s1,"-diff_hdr",8);
                  if (iVar2 == 0) {
                    opts->diff_hdr = 1;
                  }
                  else {
                    iVar2 = strncmp((char *)__s1,"-diff_nim",8);
                    if (iVar2 == 0) {
                      opts->diff_nim = 1;
                    }
                    else {
                      iVar2 = strncmp((char *)__s1,"-disp_exts",7);
                      if (iVar2 == 0) {
                        opts->disp_exts = 1;
                      }
                      else {
                        iVar2 = strncmp((char *)__s1,"-disp_hdr",8);
                        if (iVar2 == 0) {
                          opts->disp_hdr = 1;
                        }
                        else {
                          iVar2 = strncmp((char *)__s1,"-disp_nim",8);
                          if (iVar2 == 0) {
                            opts->disp_nim = 1;
                          }
                          else {
                            iVar2 = strncmp((char *)__s1,"-disp_ana",8);
                            if (iVar2 == 0) {
                              opts->disp_ana = 1;
                            }
                            else {
                              iVar2 = strncmp((char *)__s1,"-dci_lines",6);
                              if ((iVar2 == 0) ||
                                 (iVar2 = strncmp((char *)__s1,"-dts_lines",6), iVar2 == 0)) {
                                opts->dci_lines = 1;
                              }
                              else {
                                iVar2 = strncmp((char *)__s1,"-disp_collapsed_image",10);
                                if ((iVar2 == 0) ||
                                   (iVar2 = strncmp((char *)__s1,"-disp_ci",8), iVar2 == 0)) {
                                  opts->ci_dims[0] = 0;
                                  bVar14 = false;
                                  uVar11 = 0;
                                  do {
                                    iVar2 = (int)uVar11;
                                    if ((long)uVar4 <= (long)(lVar5 + 1 + uVar11)) {
                                      process_opts_cold_9();
                                      local_97c = 1;
                                      goto LAB_0010735e;
                                    }
                                    ppuVar7 = __ctype_b_loc();
                                    pcVar9 = argv[lVar5 + uVar11 + 1];
                                    if (((*(byte *)((long)*ppuVar7 + (long)*pcVar9 * 2 + 1) & 8) ==
                                         0) && (iVar3 = strcmp(pcVar9,"-1"), iVar3 != 0)) {
                                      fprintf(_stderr,
                                              "** -disp_ci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                              ,(ulong)(iVar2 + 1),pcVar9);
                                      local_97c = 0xffffffff;
                                      goto LAB_0010735e;
                                    }
                                    uVar6 = uVar11 + 1;
                                    iVar3 = atoi(pcVar9);
                                    opts->ci_dims[uVar11 + 1] = iVar3;
                                    bVar14 = 6 < uVar6;
                                    uVar11 = uVar6;
                                  } while (uVar6 != 7);
                                  opts->dci = 1;
LAB_0010735e:
                                  if (!bVar14) {
                                    return local_97c;
                                  }
                                  uVar10 = uVar10 + 1 + iVar2;
                                }
                                else {
                                  iVar2 = strncmp((char *)__s1,"-disp_ts",10);
                                  if ((iVar2 == 0) ||
                                     (iVar2 = strncmp((char *)__s1,"-dts",4), iVar2 == 0)) {
                                    bVar14 = false;
                                    uVar11 = 0;
                                    do {
                                      iVar2 = (int)uVar11;
                                      if ((long)uVar4 <= (long)(lVar5 + 1 + uVar11)) {
                                        process_opts_cold_8();
                                        local_97c = 1;
                                        goto LAB_001073f5;
                                      }
                                      ppuVar7 = __ctype_b_loc();
                                      if ((*(byte *)((long)*ppuVar7 +
                                                    (long)*argv[lVar5 + uVar11 + 1] * 2 + 1) & 8) ==
                                          0) {
                                        fprintf(_stderr,
                                                "** -dts param %d (= \'%s\') is not a number\n   consider: \'nifti_tool -help\'\n"
                                                ,(ulong)(iVar2 + 1));
                                        local_97c = 0xffffffff;
                                        goto LAB_001073f5;
                                      }
                                      uVar6 = uVar11 + 1;
                                      iVar3 = atoi(argv[lVar5 + uVar11 + 1]);
                                      opts->ci_dims[uVar11 + 1] = iVar3;
                                      bVar14 = 2 < uVar6;
                                      uVar11 = uVar6;
                                    } while (uVar6 != 3);
                                    opts->ci_dims[0] = 0;
                                    opts->ci_dims[4] = -1;
                                    opts->ci_dims[5] = -1;
                                    opts->ci_dims[6] = -1;
                                    opts->ci_dims[7] = -1;
                                    opts->dts = 1;
LAB_001073f5:
                                    if (!bVar14) {
                                      return local_97c;
                                    }
                                    uVar10 = uVar10 + 1 + iVar2;
                                  }
                                  else {
                                    iVar2 = strncmp((char *)__s1,"-field",2);
                                    if (iVar2 == 0) {
                                      uVar10 = uVar10 + 1;
                                      if (argc <= (int)uVar10) {
                                        process_opts_cold_7();
                                        return 1;
                                      }
                                      iVar2 = add_string(&opts->flist,argv[(int)uVar10]);
                                      if (iVar2 != 0) {
                                        return -1;
                                      }
                                    }
                                    else {
                                      iVar2 = strncmp((char *)__s1,"-infiles",3);
                                      if (iVar2 == 0) {
                                        uVar12 = uVar10 + 1;
                                        uVar13 = 0;
                                        uVar1 = uVar12;
                                        if ((int)uVar12 < argc) {
                                          lVar5 = (long)(int)uVar12;
                                          pcVar9 = argv[lVar5];
                                          uVar13 = 0;
                                          uVar1 = uVar10;
                                          if (*pcVar9 != '-') {
                                            uVar13 = ~uVar10 + argc;
                                            lVar8 = 0;
                                            do {
                                              iVar2 = add_string(&opts->infiles,pcVar9);
                                              if (iVar2 != 0) {
                                                uVar10 = uVar10 + (int)lVar8 + 1;
                                                local_97c = 0xffffffff;
                                                bVar14 = false;
                                                goto LAB_0010765a;
                                              }
                                              uVar12 = argc;
                                              uVar1 = argc;
                                              if ((uVar4 - 1) - lVar5 == lVar8) goto LAB_00107642;
                                              pcVar9 = argv[lVar5 + lVar8 + 1];
                                              lVar8 = lVar8 + 1;
                                            } while (*pcVar9 != '-');
                                            uVar13 = (uint)lVar8;
                                            uVar12 = uVar10 + uVar13 + 1;
                                            uVar1 = uVar10 + uVar13;
                                          }
                                        }
LAB_00107642:
                                        uVar10 = uVar12;
                                        if (uVar13 != 0) {
                                          uVar10 = uVar1;
                                        }
                                        bVar14 = true;
                                        if (2 < g_debug) {
                                          fprintf(_stderr,"+d have %d file names\n",(ulong)uVar13);
                                        }
LAB_0010765a:
                                        if (!bVar14) {
                                          return local_97c;
                                        }
                                      }
                                      else {
                                        iVar2 = strncmp((char *)__s1,"-make_image",8);
                                        if (iVar2 == 0) {
                                          opts->make_im = 1;
                                        }
                                        else {
                                          iVar2 = strncmp((char *)__s1,"-mod_field",6);
                                          if (iVar2 == 0) {
                                            if (argc <= (int)(uVar10 + 1)) {
                                              process_opts_cold_5();
                                              return 1;
                                            }
                                            iVar2 = add_string(&opts->flist,argv[(int)(uVar10 + 1)])
                                            ;
                                            if (iVar2 != 0) {
                                              return -1;
                                            }
                                            uVar10 = uVar10 + 2;
                                            if (argc <= (int)uVar10) {
                                              process_opts_cold_6();
                                              return 1;
                                            }
                                            iVar2 = add_string(&opts->vlist,argv[(int)uVar10]);
                                            if (iVar2 != 0) {
                                              return -1;
                                            }
                                          }
                                          else {
                                            iVar2 = strncmp((char *)__s1,"-mod_hdr",7);
                                            if (iVar2 == 0) {
                                              opts->mod_hdr = 1;
                                            }
                                            else {
                                              iVar2 = strncmp((char *)__s1,"-mod_nim",7);
                                              if (iVar2 == 0) {
                                                opts->mod_nim = 1;
                                              }
                                              else {
                                                iVar2 = strncmp((char *)__s1,"-keep_hist",5);
                                                if (iVar2 == 0) {
                                                  opts->keep_hist = 1;
                                                }
                                                else {
                                                  iVar2 = strncmp((char *)__s1,"-new_dim",8);
                                                  if (iVar2 == 0) {
                                                    bVar14 = false;
                                                    uVar11 = 0;
                                                    do {
                                                      uVar6 = uVar11;
                                                      if ((long)uVar4 <= (long)(uVar6 + lVar5 + 1))
                                                      {
                                                        process_opts_cold_4();
                                                        local_97c = 1;
                                                        break;
                                                      }
                                                      ppuVar7 = __ctype_b_loc();
                                                      pcVar9 = argv[lVar5 + uVar6 + 1];
                                                      if (((*(byte *)((long)*ppuVar7 +
                                                                     (long)*pcVar9 * 2 + 1) & 8) ==
                                                           0) && (iVar2 = strcmp(pcVar9,"-1"),
                                                                 iVar2 != 0)) {
                                                        fprintf(_stderr,
                                                  "** -new_dim param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                                  ,uVar6 & 0xffffffff,pcVar9);
                                                  local_97c = 0xffffffff;
                                                  break;
                                                  }
                                                  iVar2 = atoi(pcVar9);
                                                  opts->new_dim[uVar6] = iVar2;
                                                  bVar14 = 6 < uVar6;
                                                  uVar11 = uVar6 + 1;
                                                  } while (uVar6 + 1 != 8);
                                                  if (!bVar14) {
                                                    return local_97c;
                                                  }
                                                  uVar10 = uVar10 + 1 + (int)uVar6;
                                                  }
                                                  else {
                                                    iVar2 = strncmp((char *)__s1,"-new_datatype",10)
                                                    ;
                                                    if (iVar2 == 0) {
                                                      uVar10 = uVar10 + 1;
                                                      if (argc <= (int)uVar10) {
                                                        process_opts_cold_3();
                                                        return 1;
                                                      }
                                                      iVar2 = atoi(argv[(int)uVar10]);
                                                      opts->new_datatype = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strncmp((char *)__s1,"-overwrite",6);
                                                      if (iVar2 == 0) {
                                                        opts->overwrite = 1;
                                                      }
                                                      else {
                                                        iVar2 = strncmp((char *)__s1,"-prefix",4);
                                                        if (iVar2 == 0) {
                                                          uVar10 = uVar10 + 1;
                                                          if (argc <= (int)uVar10) {
                                                            process_opts_cold_2();
                                                            return 1;
                                                          }
                                                          opts->prefix = argv[(int)uVar10];
                                                        }
                                                        else {
                                                          iVar2 = strncmp((char *)__s1,"-quiet",3);
                                                          if (iVar2 == 0) {
                                                            opts->debug = 0;
                                                          }
                                                          else {
                                                            iVar2 = strncmp((char *)__s1,"-rm_ext",7
                                                                           );
                                                            if (iVar2 == 0) {
                                                              uVar10 = uVar10 + 1;
                                                              if (argc <= (int)uVar10) {
                                                                process_opts_cold_1();
                                                                return 1;
                                                              }
                                                              pcVar9 = argv[(int)uVar10];
                                                              iVar2 = strcmp(pcVar9,"ALL");
                                                              if (iVar2 == 0) {
                                                                iVar2 = add_string(slist,"-1");
                                                                if (iVar2 != 0) {
                                                                  return -1;
                                                                }
                                                              }
                                                              else {
                                                                iVar2 = atoi(pcVar9);
                                                                if ((iVar2 == -1) ||
                                                                   ((iVar2 < 0x3e9 &&
                                                                    (ppuVar7 = __ctype_b_loc(),
                                                                    (*(byte *)((long)*ppuVar7 +
                                                                              (long)*pcVar9 * 2 + 1)
                                                                    & 8) != 0)))) {
                                                                  iVar2 = add_string(slist,pcVar9);
                                                                  bVar14 = iVar2 == 0;
                                                                  local_97c = local_97c |
                                                                              -(uint)(iVar2 != 0);
                                                                }
                                                                else {
                                                                  bVar14 = false;
                                                                  fprintf(_stderr,
                                                  "** \'-rm_ext\' requires an extension index (read \'%s\')\n"
                                                  ,pcVar9);
                                                  local_97c = 0xffffffff;
                                                  }
                                                  if (!bVar14) {
                                                    return local_97c;
                                                  }
                                                  }
                                                  opts->rm_exts = 1;
                                                  }
                                                  else {
                                                    iVar2 = strncmp((char *)__s1,"-strip_extras",6);
                                                    if (iVar2 == 0) {
                                                      opts->strip = 1;
                                                    }
                                                    else {
                                                      iVar2 = strncmp((char *)__s1,
                                                                      "-swap_as_analyze",0xc);
                                                      if (iVar2 == 0) {
                                                        opts->swap_ana = 1;
                                                      }
                                                      else {
                                                        iVar2 = strncmp((char *)__s1,
                                                                        "-swap_as_nifti",0xc);
                                                        if (iVar2 == 0) {
                                                          opts->swap_hdr = 1;
                                                        }
                                                        else {
                                                          iVar2 = strncmp((char *)__s1,
                                                                          "-swap_as_old",0xc);
                                                          if (iVar2 != 0) {
                                                            fprintf(_stderr,
                                                  "** unknown option: \'%s\'\n",__s1);
                                                  return -1;
                                                  }
                                                  opts->swap_old = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
      if (argc <= (int)uVar10) {
        if (opts->make_im != 0) {
          if (0 < (opts->infiles).len) {
            process_opts_cold_14();
            return -1;
          }
          opts->cbl = 1;
          iVar2 = add_string(&opts->infiles,"MAKE_IM");
          if (iVar2 != 0) {
            return -1;
          }
        }
        if ((opts->add_exts != 0) && ((opts->elist).len != (opts->etypes).len)) {
          fprintf(_stderr,"** ext list length (%d) != etype length (%d)\n");
          return -1;
        }
        g_debug = opts->debug;
        nifti_set_debug_level(g_debug);
        fill_cmd_string(opts,argc,argv);
        if (2 < g_debug) {
          disp_nt_opts("options read: ",opts);
          return 0;
        }
        return 0;
      }
    } while( true );
  }
  use_full((char *)prog);
  return 1;
}

Assistant:

int process_opts( int argc, char * argv[], nt_opts * opts )
{
   int ac;

   memset(opts, 0, sizeof(*opts));

   opts->prefix = NULL;
   opts->debug = 1;  /* init debug level to basic output */

   /* init options for creating a new dataset via "MAKE_IM" */
   opts->new_datatype = NIFTI_TYPE_INT16;
   opts->new_dim[0] = 3;
   opts->new_dim[1] = 1;  opts->new_dim[2] = 1;  opts->new_dim[3] = 1;

   if( argc < 2 ) return usage(argv[0], USE_FULL);

   /* terminal options are first, the rest are sorted */
   for( ac = 1; ac < argc; ac++ )
   {
      if( ! strncmp(argv[ac], "-help_datatypes", 9) )
      {
         ac++;
         if( ac >= argc )
            nifti_disp_type_list(3);  /* show all types */
         else if( argv[ac][0] == 'd' || argv[ac][0] == 'D' )
            nifti_disp_type_list(1);  /* show DT_* types */
         else if( argv[ac][0] == 't' || argv[ac][0] == 'T' )
            nifti_test_datatype_sizes(1); /* test each nbyper and swapsize */
         else
            nifti_disp_type_list(2);  /* show NIFTI_* types */
         return 1;
      }
      else if( ! strncmp(argv[ac], "-help_hdr", 9) )
         return usage(argv[0], USE_FIELD_HDR);
      else if( ! strncmp(argv[ac], "-help_nim", 9) )
         return usage(argv[0], USE_FIELD_NIM);
      else if( ! strncmp(argv[ac], "-help_ana", 9) )
         return usage(argv[0], USE_FIELD_ANA);
      else if( ! strncmp(argv[ac], "-help", 5) )
         return usage(argv[0], USE_FULL);
      else if( ! strncmp(argv[ac], "-hist", 5) )
         return usage(argv[0], USE_HIST);
      else if( ! strncmp(argv[ac], "-ver", 2) )
         return usage(argv[0], USE_VERSION);
      else if( ! strncmp(argv[ac], "-nifti_hist", 11) )
      {
         nifti_disp_lib_hist();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-nifti_ver", 10) )
      {
         nifti_disp_lib_version();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-with_zlib", 5) ) {
         printf("Was NIfTI library compiled with zlib?  %s\n",
                nifti_compiled_with_zlib() ? "YES" : "NO");
         return 1;
      }

      /* begin normal execution options... */
      else if( ! strncmp(argv[ac], "-add_afni_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_afni_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_AFNI) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-add_comment_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_comment_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_COMMENT) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-check_hdr", 10) )
         opts->check_hdr = 1;
      else if( ! strncmp(argv[ac], "-check_nim", 10) )
         opts->check_nim = 1;
      else if( ! strncmp(argv[ac], "-copy_brick_list", 11) ||
               ! strncmp(argv[ac], "-copy_im", 10) ||
               ! strncmp(argv[ac], "-cbl", 4) )
      {
         opts->cbl = 1;
      }
      else if( ! strncmp(argv[ac], "-copy_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-cci", 4) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-cci","7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -cci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->cci = 1;
      }
      else if( ! strncmp(argv[ac], "-debug", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-debug");
         opts->debug = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-diff_hdr", 8) )
         opts->diff_hdr = 1;
      else if( ! strncmp(argv[ac], "-diff_nim", 8) )
         opts->diff_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_exts", 7) )
         opts->disp_exts = 1;
      else if( ! strncmp(argv[ac], "-disp_hdr", 8) )
         opts->disp_hdr = 1;
      else if( ! strncmp(argv[ac], "-disp_nim", 8) )
         opts->disp_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_ana", 8) )
         opts->disp_ana = 1;
      else if( ! strncmp(argv[ac], "-dci_lines", 6) ||   /* before -dts */
               ! strncmp(argv[ac], "-dts_lines", 6) )
      {
         opts->dci_lines = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-disp_ci", 8) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-disp_ci",
                               "7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -disp_ci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->dci = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_ts", 10) ||
               ! strncmp(argv[ac], "-dts", 4) )
      {
         /* we need to read in the ijk indices into the ci_dims array */
         int index;
         for( index = 1; index <= 3; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-dts","i,j,k indices are requied\n");
            if( ! isdigit(argv[ac][0]) ){
               fprintf(stderr,"** -dts param %d (= '%s') is not a number\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }
         /* and fill the rest of the array */
         opts->ci_dims[0] = 0;
         for( index = 4; index < 8; index++ ) opts->ci_dims[index] = -1;

         opts->dts = 1;
      }
      else if( ! strncmp(argv[ac], "-field", 2) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
      }
      else if( ! strncmp(argv[ac], "-infiles", 3) )
      {
         int count;
         /* for -infiles, get all next arguments until a '-' or done */
         ac++;
         for( count = 0; (ac < argc) && (argv[ac][0] != '-'); ac++, count++ )
            if( add_string(&opts->infiles, argv[ac]) ) return -1;/* add field */
         if( count > 0 && ac < argc ) ac--;  /* more options to process */
         if( g_debug > 2 ) fprintf(stderr,"+d have %d file names\n", count);
      }
      else if( ! strncmp(argv[ac], "-make_image", 8) )
      {
         opts->make_im = 1;  /* will setup later, as -cbl and MAKE_IM */
      }
      else if( ! strncmp(argv[ac], "-mod_field", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field (2)");
         if( add_string(&opts->vlist, argv[ac]) ) return -1; /* add value */
      }
      else if( ! strncmp(argv[ac], "-mod_hdr", 7) )
         opts->mod_hdr = 1;
      else if( ! strncmp(argv[ac], "-mod_nim", 7) )
         opts->mod_nim = 1;
      else if( ! strncmp(argv[ac], "-keep_hist", 5) )
         opts->keep_hist = 1;
      else if( ! strncmp(argv[ac], "-new_dim", 8) )
      {
         /* we need to read in the 8 dimension values */
         int index;
         for( index = 0; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-new_dim","8 dim values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -new_dim param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->new_dim[index] = atoi(argv[ac]);
         }
      }
      else if( ! strncmp(argv[ac], "-new_datatype", 10) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-new_datatype");
         opts->new_datatype = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-overwrite", 6) )
         opts->overwrite = 1;
      else if( ! strncmp(argv[ac], "-prefix", 4) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-prefix");
         opts->prefix = argv[ac];
      }
      else if( ! strncmp(argv[ac], "-quiet", 3) )
         opts->debug = 0;
      else if( ! strncmp(argv[ac], "-rm_ext", 7) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-rm_ext");
         if( strcmp(argv[ac],"ALL") == 0 )  /* special case, pass -1 */
         {
            if( add_string(&opts->elist, "-1") ) return -1;
         }
         else
         {
            int index = atoi(argv[ac]);
            if( (index != -1) && ((index > 1000) || !isdigit(*argv[ac])) ){
               fprintf(stderr,
                    "** '-rm_ext' requires an extension index (read '%s')\n",
                    argv[ac]);
               return -1;
            }
            if( add_string(&opts->elist, argv[ac]) ) return -1;
         }
         opts->rm_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-strip_extras", 6) )
         opts->strip = 1;
      else if( ! strncmp(argv[ac], "-swap_as_analyze", 12) )
         opts->swap_ana = 1;
      else if( ! strncmp(argv[ac], "-swap_as_nifti", 12) )
         opts->swap_hdr = 1;
      else if( ! strncmp(argv[ac], "-swap_as_old", 12) )
         opts->swap_old = 1;
      else
      {
         fprintf(stderr,"** unknown option: '%s'\n", argv[ac]);
         return -1;
      }
   }

   if( opts->make_im )
   {
      if( opts->infiles.len > 0 )
      {
         fprintf(stderr,"** -infiles is invalid when using -make_im\n");
         return -1;
      }
      /* apply -make_im via -cbl and "MAKE_IM" */
      opts->cbl = 1;
      if( add_string(&opts->infiles, NT_MAKE_IM_NAME) ) return -1;
   }

   /* verify for programming purposes */
   if( opts->add_exts && ( opts->elist.len != opts->etypes.len ) )
   {
      fprintf(stderr,"** ext list length (%d) != etype length (%d)\n",
              opts->elist.len, opts->etypes.len);
      return -1;
   }

   g_debug = opts->debug;
   nifti_set_debug_level(g_debug);

   fill_cmd_string(opts, argc, argv);  /* copy this command */

   if( g_debug > 2 ) disp_nt_opts("options read: ", opts);

   return 0;
}